

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall
PKCS12Test_TestEmptyPassword_Test::~PKCS12Test_TestEmptyPassword_Test
          (PKCS12Test_TestEmptyPassword_Test *this)

{
  PKCS12Test_TestEmptyPassword_Test *this_local;
  
  ~PKCS12Test_TestEmptyPassword_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PKCS12Test, TestEmptyPassword) {
  // Generated with
  //   openssl pkcs12 -export -inkey ecdsa_p256_key.pem -in ecdsa_p256_cert.pem -password pass:  
  std::string data = GetTestData("crypto/pkcs8/test/empty_password.p12");
  TestImpl("EmptyPassword (empty password)", bssl::StringAsBytes(data), "",
           nullptr);
  TestImpl("EmptyPassword (null password)", bssl::StringAsBytes(data), nullptr,
           nullptr);

  // The above input, modified to have a constructed string.
  data = GetTestData("crypto/pkcs8/test/empty_password_ber.p12");
  TestImpl("EmptyPassword (BER, empty password)", bssl::StringAsBytes(data), "",
           nullptr);
  TestImpl("EmptyPassword (BER, null password)", bssl::StringAsBytes(data),
           nullptr, nullptr);

  // The constructed string with too much recursion.
  data = GetTestData("crypto/pkcs8/test/empty_password_ber_nested.p12");
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);
  EVP_PKEY *key = nullptr;
  CBS pkcs12 = bssl::StringAsBytes(data);
  EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, ""));
}